

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

bool duckdb::StrpTimeFormat::TryParse(string *format_string,string *text,ParseResult *result)

{
  bool bVar1;
  InvalidInputException *this;
  allocator local_129;
  anon_union_16_2_67f50693_for_value local_128;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  StrpTimeFormat format;
  
  StrpTimeFormat(&format);
  ::std::__cxx11::string::_M_assign((string *)&format.super_StrTimeFormat.format_specifier);
  StrTimeFormat::ParseFormatSpecifier(&error,format_string,&format.super_StrTimeFormat);
  if (error._M_string_length == 0) {
    string_t::string_t((string_t *)&local_128.pointer,text);
    bVar1 = Parse(&format,(string_t)local_128,result,false);
    ::std::__cxx11::string::~string((string *)&error);
    StrTimeFormat::~StrTimeFormat(&format.super_StrTimeFormat);
    return bVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b8,"Failed to parse format specifier %s: %s",&local_129);
  ::std::__cxx11::string::string((string *)&local_d8,(string *)format_string);
  ::std::__cxx11::string::string((string *)&local_f8,(string *)&error);
  InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_b8,&local_d8,&local_f8);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool StrpTimeFormat::TryParse(const string &format_string, const string &text, ParseResult &result) {
	StrpTimeFormat format;
	format.format_specifier = format_string;
	string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
	if (!error.empty()) {
		throw InvalidInputException("Failed to parse format specifier %s: %s", format_string, error);
	}
	return format.Parse(text, result);
}